

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_functionApply
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionOperand,
               size_t argumentCount,int16_t *argumentOperands,int applicationFlags)

{
  long lVar1;
  sysbvm_context_t *psVar2;
  _Bool _Var3;
  sysbvm_bitflags_t sVar4;
  sysbvm_functionEntryPoint_t functionPointer;
  sysbvm_tuple_t sVar5;
  int32_t iVar6;
  ulong uVar7;
  code *pcVar8;
  sysbvm_x86_register_t reg;
  sysbvm_x86_register_t reg_00;
  size_t i_2;
  size_t sVar9;
  undefined6 in_register_00000032;
  code *functionPointer_00;
  uint8_t *tuple;
  sysbvm_x86_register_t reg_01;
  size_t i;
  int32_t value;
  code *local_50;
  uint8_t *trampolineWritePointer;
  sysbvm_tuple_t literalFunction;
  sysbvm_context_t *local_38;
  
  tuple = (uint8_t *)CONCAT62(in_register_00000032,resultOperand);
  literalFunction = 0;
  value = (int32_t)argumentCount;
  functionPointer_00 = (code *)argumentCount;
  if ((applicationFlags & 1U) != 0) {
    tuple = (uint8_t *)(ulong)(uint)(int)functionOperand;
    _Var3 = sysbvm_bytecodeJit_getLiteralValueForOperand(jit,functionOperand,&literalFunction);
    sVar5 = literalFunction;
    if (_Var3) {
      local_38 = jit->context;
      _Var3 = sysbvm_tuple_isFunction((sysbvm_context_t *)literalFunction,(sysbvm_tuple_t)tuple);
      if ((_Var3) &&
         (sVar4 = sysbvm_function_getFlags((sysbvm_context_t *)sVar5,(sysbvm_tuple_t)tuple),
         (sVar4 & 0x202) == 0)) {
        tuple = *(uint8_t **)(sVar5 + 0x50);
        if (tuple != (uint8_t *)0x0) {
          if (((ulong)tuple & 0xf) == 0) {
            tuple = (uint8_t *)(ulong)*(uint *)(tuple + 0x10);
          }
          else {
            tuple = (uint8_t *)((ulong)tuple >> 4);
          }
          functionPointer = sysbvm_function_getNumberedPrimitiveEntryPoint(local_38,(uint32_t)tuple)
          ;
          if (functionPointer != (sysbvm_functionEntryPoint_t)0x0) {
            for (sVar9 = 0; argumentCount != sVar9; sVar9 = sVar9 + 1) {
              sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[sVar9],(int32_t)sVar9)
              ;
            }
            reg_01 = SYSBVM_X86_EBP;
            iVar6 = value;
            sysbvm_jit_x86_movS32IntoMemoryWithOffset
                      (jit,SYSBVM_X86_EBP,jit->callArgumentVectorSizeOffset,value);
            sysbvm_jit_x86_jitLoadContextInRegister(jit,reg_01);
            sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionOperand);
            sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_64_ARG2,value);
            sysbvm_jit_x86_leaRegisterWithOffset
                      (jit,SYSBVM_X86_64_ARG3,jit->callArgumentVectorOffset,iVar6);
            sysbvm_jit_x86_call(jit,functionPointer);
            sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg_00);
            sysbvm_jit_x86_movS32IntoMemoryWithOffset
                      (jit,SYSBVM_X86_EBP,jit->callArgumentVectorSizeOffset,0);
            return;
          }
        }
        if (((*(long *)(sVar5 + 0x48) != 0) &&
            (lVar1 = *(long *)(*(long *)(sVar5 + 0x48) + 0x80), lVar1 != 0)) && (lVar1 != 0x5f)) {
          uVar7 = *(ulong *)(lVar1 + 0x70);
          psVar2 = jit->context;
          if (((uVar7 == 0) || (*(sysbvm_tuple_t *)(lVar1 + 0x80) != (psVar2->roots).sessionToken))
             && ((uVar7 = *(ulong *)(lVar1 + 0x88), uVar7 == 0 ||
                 (*(sysbvm_tuple_t *)(lVar1 + 0x98) != (psVar2->roots).sessionToken)))) {
            trampolineWritePointer = (uint8_t *)0x0;
            local_50 = (code *)0x0;
            sysbvm_chunkedAllocator_allocateWithDualMapping
                      (&(psVar2->heap).codeAllocator,0x10,0x10,&trampolineWritePointer,&local_50);
            _Var3 = sysbvm_virtualMemory_lockCodePagesForWriting
                              (trampolineWritePointer,local_50,0x10);
            if (!_Var3) {
              abort();
            }
            trampolineWritePointer[0] = 0xf3;
            trampolineWritePointer[1] = '\x0f';
            trampolineWritePointer[2] = '\x1e';
            trampolineWritePointer[3] = 0xfa;
            trampolineWritePointer[4] = 'H';
            trampolineWritePointer[5] = 0xb8;
            trampolineWritePointer[6] = 0xc3;
            trampolineWritePointer[7] = 'S';
            trampolineWritePointer[8] = '\x14';
            trampolineWritePointer[9] = '\0';
            trampolineWritePointer[10] = '\0';
            trampolineWritePointer[0xb] = '\0';
            trampolineWritePointer[0xc] = '\0';
            trampolineWritePointer[0xd] = '\0';
            trampolineWritePointer[0xe] = 0xff;
            trampolineWritePointer[0xf] = 0xe0;
            sysbvm_virtualMemory_unlockCodePagesForExecution(trampolineWritePointer,local_50,0x10);
            sVar5 = sysbvm_tuple_systemHandle_encode(jit->context,(sysbvm_systemHandle_t)local_50);
            *(sysbvm_tuple_t *)(lVar1 + 0x88) = sVar5;
            tuple = trampolineWritePointer;
            sVar5 = sysbvm_tuple_systemHandle_encode
                              (jit->context,(sysbvm_systemHandle_t)trampolineWritePointer);
            *(sysbvm_tuple_t *)(lVar1 + 0x90) = sVar5;
            *(sysbvm_tuple_t *)(lVar1 + 0x98) = (jit->context->roots).sessionToken;
            functionPointer_00 = local_50;
          }
          else if ((uVar7 & 0xf) == 0) {
            functionPointer_00 = *(code **)(uVar7 + 0x10);
          }
          else {
            functionPointer_00 = (code *)((long)uVar7 >> 4);
          }
          if (functionPointer_00 != (code *)0x0) {
            pcVar8 = functionPointer_00;
            for (sVar9 = 0; iVar6 = (int32_t)pcVar8, argumentCount != sVar9; sVar9 = sVar9 + 1) {
              tuple = (uint8_t *)(ulong)(uint)(int)argumentOperands[sVar9];
              sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[sVar9],(int32_t)sVar9)
              ;
            }
            sysbvm_jit_x86_jitLoadContextInRegister(jit,(sysbvm_x86_register_t)tuple);
            sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionOperand);
            sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_64_ARG2,value);
            sysbvm_jit_x86_leaRegisterWithOffset
                      (jit,SYSBVM_X86_64_ARG3,jit->callArgumentVectorOffset,iVar6);
            goto LAB_0014b5cd;
          }
        }
      }
    }
  }
  for (sVar9 = 0; iVar6 = (int32_t)functionPointer_00, argumentCount != sVar9; sVar9 = sVar9 + 1) {
    tuple = (uint8_t *)(ulong)(uint)(int)argumentOperands[sVar9];
    sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[sVar9],(int32_t)sVar9);
  }
  sysbvm_jit_x86_jitLoadContextInRegister(jit,(sysbvm_x86_register_t)tuple);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionOperand);
  sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_64_ARG2,value);
  sysbvm_jit_x86_leaRegisterWithOffset(jit,SYSBVM_X86_64_ARG3,jit->callArgumentVectorOffset,iVar6);
  sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_R8,applicationFlags);
  functionPointer_00 = sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments;
LAB_0014b5cd:
  sysbvm_jit_x86_call(jit,functionPointer_00);
  sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_functionApply(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionOperand, size_t argumentCount, int16_t *argumentOperands, int applicationFlags)
{
    bool isNoTypecheck = applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK;

    // Are we calling a literal function?
    sysbvm_tuple_t literalFunction = SYSBVM_NULL_TUPLE;

    if(isNoTypecheck
        && sysbvm_bytecodeJit_getLiteralValueForOperand(jit, functionOperand, &literalFunction)
        && sysbvm_tuple_isFunction(jit->context, literalFunction)
        && !sysbvm_function_isMemoized(jit->context, literalFunction)
        && !sysbvm_function_isVariadic(jit->context, literalFunction))
    {
        // Is this a numbered primitive.
        sysbvm_function_t *literalFunctionObject = (sysbvm_function_t*)literalFunction;
        if(literalFunctionObject->primitiveTableIndex)
        {
            uint32_t primitiveNumber = sysbvm_tuple_uint32_decode(literalFunctionObject->primitiveTableIndex);
            sysbvm_functionEntryPoint_t entryPoint = sysbvm_function_getNumberedPrimitiveEntryPoint(jit->context, primitiveNumber);
            if(entryPoint)
            {
                sysbvm_jit_functionApplyDirectWithArgumentsRecord(jit, resultOperand, functionOperand, argumentCount, argumentOperands, entryPoint);
                return;
            }
        }
        
        if(literalFunctionObject->definition)
        {
            sysbvm_functionDefinition_t *literalFunctionDefinitionObject = (sysbvm_functionDefinition_t*)literalFunctionObject->definition;
            if(literalFunctionDefinitionObject->bytecode && literalFunctionDefinitionObject->bytecode != SYSBVM_PENDING_MEMOIZATION_VALUE)
            {
                void *trampolineOrEntryPoint = sysbvm_jit_getTrampolineOrEntryPointForBytecode(jit, (sysbvm_functionBytecode_t*)literalFunctionDefinitionObject->bytecode);
                if(trampolineOrEntryPoint)
                {
                    //printf("trampolineOrEntryPoint %p\n", trampolineOrEntryPoint);
                    sysbvm_jit_functionApplyDirectVia(jit, resultOperand, functionOperand, argumentCount, argumentOperands, trampolineOrEntryPoint);
                    return;
                }
            }
        }
    }

    sysbvm_jit_functionApplyVia(jit, resultOperand, functionOperand, argumentCount, argumentOperands, applicationFlags, &sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments);
}